

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullable.cpp
# Opt level: O2

void __thiscall
clickhouse::ColumnNullable::ColumnNullable(ColumnNullable *this,ColumnRef *nested,ColumnRef *nulls)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  runtime_error *this_00;
  __shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> local_40;
  Type local_30;
  
  std::__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(((nested->super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>);
  Type::CreateNullable(&local_30,(TypeRef *)&local_40);
  Column::Column(&this->super_Column,(TypeRef *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30.field_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnNullable_00186308;
  std::__shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->nested_).super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>,
             &nested->super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>);
  Column::As<clickhouse::ColumnVector<unsigned_char>>((Column *)&this->nulls_);
  iVar1 = (*((this->nested_).super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_Column[6])();
  iVar2 = (*((nulls->super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Column[6])();
  if (CONCAT44(extraout_var,iVar1) == CONCAT44(extraout_var_00,iVar2)) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"count of elements in nested and nulls should be the same");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ColumnNullable::ColumnNullable(ColumnRef nested, ColumnRef nulls)
    : Column(Type::CreateNullable(nested->Type()))
    , nested_(nested)
    , nulls_(nulls->As<ColumnUInt8>())
{
    if (nested_->Size() != nulls->Size()) {
        throw std::runtime_error("count of elements in nested and nulls should be the same");
    }
}